

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O0

void atan_taylor<double,6>(taylor<double,_1,_6> *t,double *a)

{
  double *pdVar1;
  double dVar2;
  int local_94;
  double local_90;
  undefined1 local_88 [8];
  taylor<double,_1,_6> x;
  taylor<double,_1,_6> invt;
  double *a_local;
  taylor<double,_1,_6> *t_local;
  
  taylor<double,_1,_6>::taylor((taylor<double,_1,_6> *)(x.super_polynomial<double,_1,_6>.c + 6));
  taylor<double,_1,_6>::taylor((taylor<double,_1,_6> *)local_88);
  local_90 = *a * *a + 1.0;
  inv_taylor<double,6>((taylor<double,_1,_6> *)(x.super_polynomial<double,_1,_6>.c + 6),&local_90);
  local_94 = 0;
  taylor<double,1,6>::operator=((taylor<double,1,6> *)local_88,&local_94);
  dVar2 = *a;
  pdVar1 = taylor<double,_1,_6>::operator[]((taylor<double,_1,_6> *)local_88,1);
  *pdVar1 = dVar2 * 2.0;
  pdVar1 = taylor<double,_1,_6>::operator[]((taylor<double,_1,_6> *)local_88,2);
  *pdVar1 = 1.0;
  taylor<double,_1,_6>::compose0<6>
            ((taylor<double,_1,_6> *)local_88,t,
             (taylor<double,_1,_6> *)(x.super_polynomial<double,_1,_6>.c + 6));
  taylor<double,_1,_6>::integrate(t);
  dVar2 = atan(*a);
  pdVar1 = taylor<double,_1,_6>::operator[](t,0);
  *pdVar1 = dVar2;
  return;
}

Assistant:

static void atan_taylor(taylor<T, 1, Ndeg> & t, const T & a) {
  // Calculate taylor expansion of 1/(1+a^2+x)
  taylor<T, 1, Ndeg> invt, x;
  inv_taylor(invt, 1 + a * a);
  // insert x = 2*a*x + x^2
  x = 0;
  if (Ndeg > 0)
    x[1] = 2 * a;
  if (Ndeg > 1)
    x[2] = 1;
  x.compose0(t, invt);
  // Integrate each term and set the constant
  t.integrate();
  t[0] = atan(a);
}